

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_fsp.cpp
# Opt level: O0

void * __thiscall ON_FixedSizePool::ThreadSafeAllocateElement(ON_FixedSizePool *this)

{
  bool bVar1;
  void *local_18;
  void *p;
  ON_FixedSizePool *this_local;
  
  local_18 = (void *)0x0;
  bVar1 = ON_SleepLock::GetLock(&this->m_sleep_lock);
  if (bVar1) {
    local_18 = AllocateElement(this);
    ON_SleepLock::ReturnLock(&this->m_sleep_lock);
  }
  return local_18;
}

Assistant:

void* ON_FixedSizePool::ThreadSafeAllocateElement()
{
  void* p = nullptr;
  {
    if ( m_sleep_lock.GetLock() )
    {
      p = AllocateElement();
      m_sleep_lock.ReturnLock();
    }
  }
  return p;
}